

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void __thiscall ConfigTest_load_Test::ConfigTest_load_Test(ConfigTest_load_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_004a3720;
  return;
}

Assistant:

TEST(ConfigTest, load) {
	config l_config;

	// Write temp file out
	std::filesystem::path file_path = make_tmp_file("load.test", "some_data");

	// Load data from disk
	l_config.load(file_path);

	// Verify
	EXPECT_EQ(l_config.data().get<std::u8string>(), u8"some_data");
	EXPECT_EQ(l_config.filename(), file_path);
	EXPECT_EQ(l_config.format(), "test");
}